

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colour_filters.cpp
# Opt level: O1

array<cv::Mat,_5UL> * filter_image(array<cv::Mat,_5UL> *__return_storage_ptr__,Mat *pretreat)

{
  long lVar1;
  array<cv::Mat,_5UL> *this;
  array<std::future<cv::Mat>,_5UL> async_result;
  undefined8 local_d8;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  Mat local_80 [96];
  
  lVar1 = 0;
  do {
    cv::Mat::Mat((Mat *)(&__return_storage_ptr__->field_0x0 + lVar1));
    lVar1 = lVar1 + 0x60;
  } while (lVar1 != 0x1e0);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((launch)local_d0,(_func_Mat_Mat_ptr *)0x3,(Mat *)filter_yellow);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((launch)local_c0,(_func_Mat_Mat_ptr *)0x3,(Mat *)filter_red);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((launch)local_b0,(_func_Mat_Mat_ptr *)0x3,(Mat *)filter_blue);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((launch)local_a0,(_func_Mat_Mat_ptr *)0x3,(Mat *)filter_black);
  std::async<cv::Mat(&)(cv::Mat_const&),cv::Mat_const&>
            ((launch)local_90,(_func_Mat_Mat_ptr *)0x3,(Mat *)filter_white);
  lVar1 = 0;
  this = __return_storage_ptr__;
  do {
    std::future<cv::Mat>::get((future<cv::Mat> *)local_80);
    cv::Mat::operator=((Mat *)this,local_80);
    cv::Mat::~Mat(local_80);
    lVar1 = lVar1 + 0x10;
    this = (array<cv::Mat,_5UL> *)&this->field_0x60;
  } while (lVar1 != 0x50);
  lVar1 = 0x50;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_d0 + lVar1 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_d0 + lVar1 + -8));
    }
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::array<cv::Mat, 5> filter_image(const cv::Mat& pretreat)
{
    std::array<cv::Mat, 5> result;
    std::array<std::future<cv::Mat>, 5> async_result {std::async(filter_yellow, pretreat),
        std::async(filter_red, pretreat), std::async(filter_blue, pretreat), std::async(filter_black, pretreat),
        std::async(filter_white, pretreat)};

    for(std::size_t i = 0; i < result.size(); i++)
    {
        result[i] = async_result[i].get();
    }
    return result;
}